

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectGenericLoopSelSwitch<duckdb::string_t,duckdb::string_t,duckdb::NotEquals,false>
                (string_t *ldata,string_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  bool bVar5;
  idx_t iVar6;
  SelectionVector *pSVar7;
  idx_t iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t local_50;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar9 = 0;
      }
      else {
        psVar1 = result_sel->sel_vector;
        psVar2 = lsel->sel_vector;
        psVar3 = rsel->sel_vector;
        lVar9 = 0;
        uVar13 = 0;
        do {
          uVar10 = uVar13;
          if (psVar1 != (sel_t *)0x0) {
            uVar10 = (ulong)psVar1[uVar13];
          }
          uVar12 = uVar13;
          if (psVar2 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar2[uVar13];
          }
          uVar11 = uVar13;
          if (psVar3 != (sel_t *)0x0) {
            uVar11 = (ulong)psVar3[uVar13];
          }
          puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((((puVar4 != (unsigned_long *)0x0) &&
               ((puVar4[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0)) ||
              ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
               puVar4 != (unsigned_long *)0x0 && ((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0)
               ))) || (bVar5 = string_t::operator==(ldata + uVar12,rdata + uVar11), bVar5)) {
            false_sel->sel_vector[lVar9] = (sel_t)uVar10;
            lVar9 = lVar9 + 1;
          }
          uVar13 = uVar13 + 1;
        } while (count != uVar13);
      }
      return count - lVar9;
    }
    if (count != 0) {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      local_50 = 0;
      uVar13 = 0;
      do {
        uVar10 = uVar13;
        if (psVar1 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar1[uVar13];
        }
        uVar12 = uVar13;
        if (psVar2 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar2[uVar13];
        }
        uVar11 = uVar13;
        if (psVar3 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar3[uVar13];
        }
        puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((((puVar4 == (unsigned_long *)0x0) ||
             ((puVar4[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)) &&
            ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)))
            ) && (bVar5 = string_t::operator==(ldata + uVar12,rdata + uVar11), !bVar5)) {
          true_sel->sel_vector[local_50] = (sel_t)uVar10;
          local_50 = local_50 + 1;
        }
        uVar13 = uVar13 + 1;
      } while (count != uVar13);
      return local_50;
    }
  }
  else if (count != 0) {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_50 = 0;
    iVar8 = 0;
    uVar13 = 0;
    do {
      uVar10 = uVar13;
      if (psVar1 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar1[uVar13];
      }
      uVar12 = uVar13;
      if (psVar2 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar2[uVar13];
      }
      uVar11 = uVar13;
      if (psVar3 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar3[uVar13];
      }
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar4 != (unsigned_long *)0x0) && ((puVar4[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0))
          || ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar4 != (unsigned_long *)0x0 && ((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0))
             )) || (bVar5 = string_t::operator==(ldata + uVar12,rdata + uVar11), bVar5)) {
        iVar6 = iVar8;
        pSVar7 = false_sel;
        iVar8 = iVar8 + 1;
      }
      else {
        iVar6 = local_50;
        pSVar7 = true_sel;
        local_50 = local_50 + 1;
      }
      pSVar7->sel_vector[iVar6] = (sel_t)uVar10;
      uVar13 = uVar13 + 1;
    } while (count != uVar13);
    return local_50;
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}